

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

int CVmObjList::get_minmax
              (vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc,vm_rcdesc *rc,int sense,
              int want_index)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  uint uVar6;
  int i;
  ulong uVar7;
  uint uVar8;
  vm_val_t *this;
  char *buf;
  vm_val_t ele;
  vm_val_t winner;
  int local_74;
  vm_val_t local_68;
  vm_val_t *local_50;
  vm_val_t local_48;
  vm_rcdesc *local_38;
  
  if (in_argc == (uint *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *in_argc;
  }
  local_38 = rc;
  if (get_minmax(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,vm_rcdesc_const*,int,int)::desc
      == '\0') {
    get_minmax();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,in_argc,&get_minmax::desc);
  if (iVar5 == 0) {
    if (uVar8 == 0) {
      this = (vm_val_t *)0x0;
    }
    else {
      this = sp_ + -1;
      iVar5 = vm_val_t::is_func_ptr(this);
      if (iVar5 == 0) {
        err_throw(0x900);
      }
    }
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    uVar1 = *(ushort *)lst;
    local_50 = retval;
    if ((ulong)uVar1 == 0) {
      err_throw(0x902);
    }
    buf = lst + 2;
    uVar7 = 0;
    local_74 = 0;
    do {
      local_68.typ = (int)*buf;
      vmb_get_dh_val(buf,&local_68);
      pvVar4 = sp_;
      if (this != (vm_val_t *)0x0) {
        sp_ = sp_ + 1;
        pvVar4->typ = local_68.typ;
        *(undefined4 *)&pvVar4->field_0x4 = local_68._4_4_;
        pvVar4->val = local_68.val;
        CVmRun::call_func_ptr(&G_interpreter_X,this,1,local_38,0);
        local_68.typ = r0_.typ;
        local_68._4_4_ = r0_._4_4_;
        local_68.val = r0_.val;
      }
      if (uVar7 == 0) {
        local_48.typ = local_68.typ;
        local_48._4_4_ = local_68._4_4_;
        local_48.val = local_68.val;
        local_74 = 0;
      }
      else {
        uVar6 = vm_val_t::compare_to(&local_68,&local_48);
        if (0 < (int)uVar6 && 0 < sense || (int)(uVar6 & sense) < 0) {
          local_48.typ = local_68.typ;
          local_48._4_4_ = local_68._4_4_;
          local_48.val = local_68.val;
          local_74 = (int)uVar7;
        }
      }
      uVar7 = uVar7 + 1;
      buf = buf + 5;
    } while (uVar1 != uVar7);
    sp_ = sp_ + -(long)(int)(uVar8 + 1);
    if (want_index == 0) {
      local_50->typ = local_48.typ;
      *(undefined4 *)&local_50->field_0x4 = local_48._4_4_;
      local_50->val = local_48.val;
    }
    else {
      local_50->typ = VM_INT;
      (local_50->val).obj = local_74 + 1;
    }
  }
  return 1;
}

Assistant:

int CVmObjList::get_minmax(VMG_ vm_val_t *retval,
                           const vm_val_t *self_val,
                           const char *lst, uint *in_argc,
                           const vm_rcdesc *rc, int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* if there are no elements, this is an error */
    int cnt = vmb_get_len(lst);
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element_const(lst, i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);
    
    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}